

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_instance.cpp
# Opt level: O1

void __thiscall
ON_ReferencedComponentSettingsImpl::AfterLayerTableAddedToModelImpl
          (ON_ReferencedComponentSettingsImpl *this,ON_ComponentManifest *source_archive_manifest,
          ON_ComponentManifest *model_manifest,ON_ManifestMap *archive_to_model_map)

{
  ON_UuidPairList2 *this_00;
  ON_Layer **ppOVar1;
  ON_Layer *this_01;
  Type TVar2;
  bool bVar3;
  ON_UUID *pOVar4;
  ON_ManifestMapItem *pOVar5;
  ON_UUID *id2;
  long lVar6;
  long lVar7;
  ON_ManifestMapItem map_item;
  int local_7c;
  ON_ManifestMapItem local_68;
  
  InternalDestroyLayerArray(&this->m_layer_model_copy);
  this_00 = &this->m_runtime_layer_id_map;
  ON_UuidPairList2::Empty(this_00);
  if ((this->m_layer_referenced_file_copy).m_count < 1) {
    local_7c = 0;
  }
  else {
    lVar7 = 0;
    local_7c = 0;
    do {
      ppOVar1 = (this->m_layer_referenced_file_copy).m_a;
      this_01 = ppOVar1[lVar7];
      if (this_01 != (ON_Layer *)0x0) {
        ppOVar1[lVar7] = (ON_Layer *)0x0;
        pOVar4 = ON_ModelComponent::Id(&this_01->super_ON_ModelComponent);
        pOVar5 = ON_ManifestMap::MapItemFromSourceId(archive_to_model_map,pOVar4);
        local_68.m_component_type = pOVar5->m_component_type;
        local_68._1_3_ = *(undefined3 *)&pOVar5->field_0x1;
        local_68.m_reserved = pOVar5->m_reserved;
        local_68.m_source_index = pOVar5->m_source_index;
        local_68.m_destination_index = pOVar5->m_destination_index;
        local_68.m_source_id.Data1 = (pOVar5->m_source_id).Data1;
        local_68.m_source_id.Data2 = (pOVar5->m_source_id).Data2;
        local_68.m_source_id.Data3 = (pOVar5->m_source_id).Data3;
        local_68.m_source_id.Data4 = *&(pOVar5->m_source_id).Data4;
        local_68.m_destination_id.Data1 = (pOVar5->m_destination_id).Data1;
        local_68.m_destination_id.Data2 = (pOVar5->m_destination_id).Data2;
        local_68.m_destination_id.Data3 = (pOVar5->m_destination_id).Data3;
        local_68.m_destination_id.Data4 = *&(pOVar5->m_destination_id).Data4;
        TVar2 = ON_ManifestMapItem::ComponentType(&local_68);
        if (TVar2 == Layer) {
          pOVar4 = ON_ManifestMapItem::DestinationId(&local_68);
          bVar3 = ::operator==(&ON_nil_uuid,pOVar4);
          if (!bVar3) {
            pOVar4 = ON_ManifestMapItem::SourceId(&local_68);
            id2 = ON_ManifestMapItem::DestinationId(&local_68);
            bVar3 = ON_UuidPairList2::AddPair(this_00,pOVar4,id2);
            if (bVar3) {
              ON_Layer::DeletePerViewportSettings(this_01,&ON_nil_uuid);
              lVar6 = (long)local_7c;
              local_7c = local_7c + 1;
              (this->m_layer_referenced_file_copy).m_a[lVar6] = this_01;
            }
            else {
              (*(this_01->super_ON_ModelComponent).super_ON_Object._vptr_ON_Object[4])(this_01);
            }
            goto LAB_004a19c4;
          }
        }
        (*(this_01->super_ON_ModelComponent).super_ON_Object._vptr_ON_Object[4])(this_01);
      }
LAB_004a19c4:
      lVar7 = lVar7 + 1;
    } while (lVar7 < (this->m_layer_referenced_file_copy).m_count);
  }
  if ((-1 < local_7c) && (local_7c <= (this->m_layer_referenced_file_copy).m_capacity)) {
    (this->m_layer_referenced_file_copy).m_count = local_7c;
  }
  ON_UuidPairList2::ImproveSearchSpeed(this_00);
  return;
}

Assistant:

void ON_ReferencedComponentSettingsImpl::AfterLayerTableAddedToModelImpl(
  const class ON_ComponentManifest& source_archive_manifest,
  const class ON_ComponentManifest& model_manifest,
  const class ON_ManifestMap& archive_to_model_map
)
{
  InternalDestroyLayerArray(m_layer_model_copy);
  m_runtime_layer_id_map.Empty();
  int count = 0;
  for (int i = 0; i < m_layer_referenced_file_copy.Count(); i++)
  {
    ON_Layer* layer = m_layer_referenced_file_copy[i];
    if (nullptr == layer)
      continue;
    m_layer_referenced_file_copy[i] = nullptr;
    ON_ManifestMapItem map_item = archive_to_model_map.MapItemFromSourceId(layer->Id());
    if (ON_ModelComponent::Type::Layer != map_item.ComponentType() || ON_nil_uuid == map_item.DestinationId())
    {
      delete layer;
      continue;
    }
    if (false == m_runtime_layer_id_map.AddPair(map_item.SourceId(),map_item.DestinationId()))
    {
      delete layer;
      continue;
    }
    // If this layer came from reading a non-.3dm file,
    // it might have per viewport settings that apply to 
    // the viewports in the reference file.
    // These viewports are not in the current model and
    // any reference file per viewport settings should be deleted.
    layer->DeletePerViewportSettings(ON_nil_uuid);

    m_layer_referenced_file_copy[count++] = layer;
  }
  m_layer_referenced_file_copy.SetCount(count);
  m_runtime_layer_id_map.ImproveSearchSpeed();
}